

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int PHYSFS_enumerate(char *_fn,PHYSFS_EnumerateCallback cb,void *data)

{
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var1;
  void *pvVar2;
  _func_PHYSFS_EnumerateCallbackResult_void_ptr_char_ptr_PHYSFS_EnumerateCallback_char_ptr_void_ptr
  *p_Var3;
  ulong *puVar4;
  char *pcVar5;
  int iVar6;
  PHYSFS_EnumerateCallbackResult PVar7;
  size_t sVar8;
  ulong *puVar9;
  ErrState *pEVar10;
  ulong *puVar11;
  PHYSFS_ErrorCode errcode;
  __PHYSFS_DIRHANDLE__ *h;
  uint uVar12;
  void *pvVar13;
  bool bVar14;
  ulong uStack_a8;
  undefined1 local_a0 [8];
  PHYSFS_Stat statbuf;
  SymlinkFilterData filterdata;
  ulong *local_48;
  char *arcfname;
  void *local_38;
  
  puVar11 = &uStack_a8;
  if ((_fn == (char *)0x0) || (cb == (PHYSFS_EnumerateCallback)0x0)) {
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
  }
  else {
    sVar8 = strlen(_fn);
    if (sVar8 + 1 < 0x100) {
      puVar9 = (ulong *)((long)&uStack_a8 - (sVar8 + 0x18 & 0xfffffffffffffff0));
      puVar11 = puVar9;
    }
    else {
      puVar9 = (ulong *)0x0;
      puVar11 = &uStack_a8;
    }
    bVar14 = puVar9 == (ulong *)0x0;
    local_38 = data;
    if (bVar14) {
      puVar11[-1] = 0x108174;
      puVar9 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar8 + 9);
    }
    if (puVar9 == (ulong *)0x0) {
      puVar9 = (ulong *)0x0;
    }
    else {
      *puVar9 = (ulong)bVar14;
      puVar9 = puVar9 + 1;
    }
    pvVar13 = local_38;
    if (puVar9 != (ulong *)0x0) {
      puVar11[-1] = 0x1081a4;
      iVar6 = sanitizePlatformIndependentPath(_fn,(char *)puVar9);
      if (iVar6 == 0) {
        uVar12 = 1;
      }
      else {
        puVar11[-1] = 0x1081b8;
        __PHYSFS_platformGrabMutex(stateLock);
        if (allowSymLinks == 0) {
          statbuf._32_8_ = cb;
        }
        h = searchPath;
        arcfname = (char *)cb;
        if (searchPath == (DirHandle *)0x0) {
          uVar12 = 1;
        }
        else {
          do {
            local_48 = puVar9;
            puVar11[-1] = 0x1081ff;
            iVar6 = partOfMountPoint(h,(char *)puVar9);
            pcVar5 = arcfname;
            if (iVar6 == 0) {
              puVar11[-1] = 0x10822a;
              iVar6 = verifyPath(h,(char **)&local_48,0);
              puVar4 = local_48;
              if (iVar6 == 0) {
                PVar7 = PHYSFS_ENUM_OK;
              }
              else {
                pvVar13 = h->opaque;
                p_Var1 = h->funcs->stat;
                puVar11[-1] = 0x108247;
                iVar6 = (*p_Var1)(pvVar13,(char *)puVar4,(PHYSFS_Stat *)local_a0);
                if (iVar6 == 0) {
                  puVar11[-1] = 0x10825e;
                  pEVar10 = findErrorForCurrentThread();
                  if (pEVar10 == (ErrState *)0x0) {
                    bVar14 = true;
                  }
                  else {
                    bVar14 = pEVar10->code != PHYSFS_ERR_NOT_FOUND;
                  }
                  PVar7 = PHYSFS_ENUM_OK;
                  pvVar13 = local_38;
                  if (!bVar14) goto LAB_001082a5;
                }
                pvVar13 = local_38;
                pcVar5 = arcfname;
                PVar7 = PHYSFS_ENUM_OK;
                if ((int)statbuf.accesstime == 1) {
                  if ((allowSymLinks == 0) && ((h->funcs->info).supportsSymlinks != 0)) {
                    pvVar13 = h->opaque;
                    p_Var3 = h->funcs->enumerate;
                    puVar11[-1] = 0x1082ea;
                    PVar7 = (*p_Var3)(pvVar13,(char *)puVar4,enumCallbackFilterSymLinks,_fn,
                                      &statbuf.filetype);
                    pvVar13 = local_38;
                    if (PVar7 == PHYSFS_ENUM_ERROR) {
                      puVar11[-1] = 0x1082f6;
                      pEVar10 = findErrorForCurrentThread();
                      PVar7 = PHYSFS_ENUM_ERROR;
                      pvVar13 = local_38;
                      if ((pEVar10 != (ErrState *)0x0) && (pEVar10->code == PHYSFS_ERR_APP_CALLBACK)
                         ) {
                        puVar11[-1] = 0x10830e;
                        PHYSFS_setErrorCode(PHYSFS_ERR_OK);
                        pvVar13 = local_38;
                      }
                    }
                  }
                  else {
                    pvVar2 = h->opaque;
                    p_Var3 = h->funcs->enumerate;
                    puVar11[-1] = 0x10829f;
                    PVar7 = (*p_Var3)(pvVar2,(char *)puVar4,(PHYSFS_EnumerateCallback)pcVar5,_fn,
                                      pvVar13);
                    pvVar13 = local_38;
                  }
                }
              }
            }
            else {
              puVar11[-1] = 0x108218;
              PVar7 = enumerateFromMountPoint
                                (h,(char *)puVar9,(PHYSFS_EnumerateCallback)pcVar5,_fn,pvVar13);
            }
LAB_001082a5:
          } while ((PVar7 == PHYSFS_ENUM_OK) && (h = h->next, h != (__PHYSFS_DIRHANDLE__ *)0x0));
          uVar12 = (uint)(PVar7 != PHYSFS_ENUM_ERROR);
        }
        puVar11[-1] = 0x108340;
        __PHYSFS_platformReleaseMutex(stateLock);
      }
      if (puVar9[-1] == 0) {
        return uVar12;
      }
      puVar11[-1] = 0x108359;
      (*__PHYSFS_AllocatorHooks.Free)(puVar9 + -1);
      return uVar12;
    }
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
  }
  *(undefined8 *)((long)puVar11 + -8) = 0x108144;
  PHYSFS_setErrorCode(errcode);
  return 0;
}

Assistant:

int PHYSFS_enumerate(const char *_fn, PHYSFS_EnumerateCallback cb, void *data)
{
    PHYSFS_EnumerateCallbackResult retval = PHYSFS_ENUM_OK;
    size_t len;
    char *fname;

    BAIL_IF(!_fn, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!cb, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    len = strlen(_fn) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);

    if (!sanitizePlatformIndependentPath(_fn, fname))
        retval = PHYSFS_ENUM_STOP;
    else
    {
        DirHandle *i;
        SymlinkFilterData filterdata;

        __PHYSFS_platformGrabMutex(stateLock);

        if (!allowSymLinks)
        {
            memset(&filterdata, '\0', sizeof (filterdata));
            filterdata.callback = cb;
            filterdata.callbackData = data;
        } /* if */

        for (i = searchPath; (retval == PHYSFS_ENUM_OK) && i; i = i->next)
        {
            char *arcfname = fname;

            if (partOfMountPoint(i, arcfname))
                retval = enumerateFromMountPoint(i, arcfname, cb, _fn, data);

            else if (verifyPath(i, &arcfname, 0))
            {
                PHYSFS_Stat statbuf;
                if (!i->funcs->stat(i->opaque, arcfname, &statbuf))
                {
                    if (currentErrorCode() == PHYSFS_ERR_NOT_FOUND)
                        continue;  /* no such dir in this archive, skip it. */
                } /* if */

                if (statbuf.filetype != PHYSFS_FILETYPE_DIRECTORY)
                    continue;  /* not a directory in this archive, skip it. */

                else if ((!allowSymLinks) && (i->funcs->info.supportsSymlinks))
                {
                    filterdata.dirhandle = i;
                    filterdata.arcfname = arcfname;
                    filterdata.errcode = PHYSFS_ERR_OK;
                    retval = i->funcs->enumerate(i->opaque, arcfname,
                                                 enumCallbackFilterSymLinks,
                                                 _fn, &filterdata);
                    if (retval == PHYSFS_ENUM_ERROR)
                    {
                        if (currentErrorCode() == PHYSFS_ERR_APP_CALLBACK)
                            PHYSFS_setErrorCode(filterdata.errcode);
                    } /* if */
                } /* else if */
                else
                {
                    retval = i->funcs->enumerate(i->opaque, arcfname,
                                                 cb, _fn, data);
                } /* else */
            } /* else if */
        } /* for */

        __PHYSFS_platformReleaseMutex(stateLock);
    } /* if */

    __PHYSFS_smallFree(fname);

    return (retval == PHYSFS_ENUM_ERROR) ? 0 : 1;
}